

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseRAPass::buildLiveness(BaseRAPass *this)

{
  uint *puVar1;
  Array<unsigned_char,_4UL> *pAVar2;
  int *piVar3;
  _func_int **pp_Var4;
  long *plVar5;
  FormatFlags FVar6;
  char *pcVar7;
  FuncNode *pFVar8;
  BaseNode *pBVar9;
  long lVar10;
  DiagnosticOptions DVar11;
  uint uVar12;
  byte bVar13;
  Error EVar14;
  int iVar15;
  BaseRAPass *pBVar16;
  undefined4 extraout_var;
  byte bVar17;
  char c;
  BaseRAPass *pBVar18;
  ulong uVar19;
  long *plVar20;
  BaseNode *pBVar21;
  BaseBuilder *pBVar22;
  uint uVar23;
  BaseRAPass *pBVar24;
  BaseRAPass *pBVar25;
  RegGroup group;
  BaseRAPass *pBVar26;
  RABlocks *pRVar27;
  uint uVar28;
  uint uVar29;
  BaseRAPass *this_00;
  BaseRAPass *pBVar30;
  undefined1 *puVar31;
  BaseRAPass *pBVar32;
  long lVar33;
  BaseRAPass *pBVar34;
  long lVar35;
  ulong uVar36;
  BaseRAPass *pBVar37;
  BaseRAPass *pBVar38;
  BaseRAPass *pBVar39;
  uint32_t newSize;
  uint uVar40;
  BaseRAPass *pBVar41;
  BaseRAPass *pBVar42;
  bool bVar43;
  float fVar44;
  float __x;
  uint uVar45;
  DiagnosticOptions DVar46;
  uint uVar47;
  uint uVar48;
  Array<unsigned_short,_2UL> AVar49;
  DiagnosticOptions DVar50;
  ZoneStack<asmjit::v1_14::RABlock_*> workList;
  ZoneVector<unsigned_int> nInstsPerBlock;
  ZoneVector<unsigned_int> nOutsPerWorkReg;
  ZoneVector<unsigned_int> nUsesPerWorkReg;
  StringTmp<512UL> sb;
  undefined1 auStack_7f8 [32];
  undefined1 auStack_7d8 [1032];
  BaseRAPass *pBStack_3d0;
  BaseRAPass *pBStack_3c8;
  BaseRAPass *pBStack_3c0;
  BaseRAPass *pBStack_3b8;
  BaseRAPass *pBStack_3b0;
  BaseRAPass *pBStack_3a8;
  ulong uStack_398;
  ulong uStack_390;
  BaseRAPass *pBStack_388;
  BaseRAPass *pBStack_380;
  BaseRAPass *pBStack_378;
  BaseRAPass *pBStack_370;
  BaseRAPass *pBStack_368;
  BaseRAPass *pBStack_360;
  uint local_34c;
  BaseRAPass *local_348;
  BaseRAPass *local_340;
  uint local_334;
  BaseRAPass *local_330;
  BaseRAPass *local_328;
  BaseRAPass *local_320;
  BaseRAPass *local_318;
  uint local_30c;
  BaseRAPass *local_308;
  ulong local_300;
  undefined1 local_2f8 [40];
  BaseRAPass *local_2d0;
  BaseRAPass *local_2c8;
  BaseRAPass *local_2c0;
  BaseRAPass *local_2b8;
  BaseRAPass *local_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  ZoneVectorBase local_278;
  Array<unsigned_short,_2UL> local_268;
  DiagnosticOptions DStack_264;
  uint uStack_260;
  uint uStack_25c;
  undefined1 local_258 [8];
  BaseBuilder *pBStack_250;
  undefined8 local_248;
  RABlocks *pRStack_240;
  RABlocks local_238 [520];
  
  if ((this->_diagnosticOptions >> 9 & 1) == 0) {
    pBVar38 = (BaseRAPass *)0x0;
  }
  else {
    pBVar38 = (BaseRAPass *)this->_logger;
  }
  fVar44 = 0.0;
  stack0xfffffffffffffda9 = SUB1615((undefined1  [16])0x0,1);
  local_258[0] = (String)0x20;
  pRStack_240 = local_238;
  local_248 = 0x207;
  local_238[0] = (RABlocks)0x0;
  local_348 = this;
  if (pBVar38 != (BaseRAPass *)0x0) {
    pBStack_360 = (BaseRAPass *)0x1269da;
    fVar44 = Logger::logf((Logger *)pBVar38,0.0);
  }
  uVar23 = *(uint *)&local_348->field_0x148;
  pBVar41 = (BaseRAPass *)(ulong)uVar23;
  if (uVar23 != 0) {
    pBVar42 = (BaseRAPass *)(ulong)*(uint *)&local_348->field_0xb8;
    pBVar26 = (BaseRAPass *)(ulong)*(uint *)&local_348->field_0xd8;
    local_278._data = (void *)0x0;
    local_278._size = 0;
    local_278._capacity = 0;
    local_288._0_8_ = (void *)0x0;
    local_288._8_4_ = 0;
    local_288._12_4_ = 0;
    local_298 = (undefined1  [16])0x0;
    pBVar24 = (BaseRAPass *)&local_348->_allocator;
    pBStack_360 = (BaseRAPass *)0x126a32;
    EVar14 = ZoneVectorBase::_resize(&local_278,(ZoneAllocator *)pBVar24,4,uVar23);
    pBVar39 = (BaseRAPass *)(ulong)EVar14;
    pBVar16 = pBVar39;
    if (EVar14 != 0) goto LAB_00127ba5;
    pBStack_360 = (BaseRAPass *)0x126a5f;
    local_340 = pBVar26;
    local_308 = pBVar42;
    EVar14 = ZoneVectorBase::_resize((ZoneVectorBase *)local_288,(ZoneAllocator *)pBVar24,4,uVar23);
    if (EVar14 != 0) {
      pBVar16 = (BaseRAPass *)(ulong)EVar14;
      goto LAB_00127ba5;
    }
    this_00 = (BaseRAPass *)local_298;
    pBStack_360 = (BaseRAPass *)0x126a85;
    EVar14 = ZoneVectorBase::_resize
                       ((ZoneVectorBase *)this_00,(ZoneAllocator *)pBVar24,4,(uint32_t)local_308);
    pBVar25 = pBVar39;
    if (EVar14 != 0) {
      pBVar25 = (BaseRAPass *)(ulong)EVar14;
    }
    uVar23 = (uint)pBVar25;
    if (EVar14 != 0) {
LAB_00126a90:
      pBVar16 = (BaseRAPass *)(ulong)uVar23;
      goto LAB_00127ba5;
    }
    local_330 = pBVar24;
    local_328 = pBVar38;
    local_320 = pBVar41;
    if ((int)local_340 != 0) {
      pBVar18 = (BaseRAPass *)0x0;
      pBVar16 = local_348;
      do {
        pBVar30 = pBVar26;
        if ((BaseRAPass *)(ulong)*(uint *)&pBVar16->field_0xd8 <= pBVar18) goto LAB_00127bf9;
        local_318 = *(BaseRAPass **)(*(long *)&(pBVar16->_pov).field_0x0 + (long)pBVar18 * 8);
        this_00 = (BaseRAPass *)&local_318->_iEmitHelper;
        newSize = (uint32_t)pBVar41;
        pBStack_360 = (BaseRAPass *)0x126b1f;
        local_2f8._32_8_ = pBVar18;
        EVar14 = ZoneBitVector::_resize
                           ((ZoneBitVector *)this_00,
                            (ZoneAllocator *)((local_318->super_FuncPass).super_Pass._vptr_Pass + 3)
                            ,newSize,newSize,false);
        pBVar24 = local_318;
        pBVar30 = (BaseRAPass *)(ulong)EVar14;
        if (EVar14 == 0) {
          this_00 = (BaseRAPass *)&local_318->_formatOptions;
          pBStack_360 = (BaseRAPass *)0x126b47;
          EVar14 = ZoneBitVector::_resize
                             ((ZoneBitVector *)this_00,
                              (ZoneAllocator *)
                              ((local_318->super_FuncPass).super_Pass._vptr_Pass + 3),newSize,
                              newSize,false);
          pBVar42 = pBVar24;
          if (EVar14 == 0) {
            this_00 = (BaseRAPass *)&pBVar24->_func;
            pBStack_360 = (BaseRAPass *)0x126b6b;
            EVar14 = ZoneBitVector::_resize
                               ((ZoneBitVector *)this_00,
                                (ZoneAllocator *)
                                ((pBVar24->super_FuncPass).super_Pass._vptr_Pass + 3),newSize,
                                newSize,false);
            if (EVar14 == 0) {
              this_00 = (BaseRAPass *)&local_318->_extraBlock;
              pBStack_360 = (BaseRAPass *)0x126b94;
              EVar14 = ZoneBitVector::_resize
                                 ((ZoneBitVector *)this_00,
                                  (ZoneAllocator *)
                                  ((local_318->super_FuncPass).super_Pass._vptr_Pass + 3),newSize,
                                  newSize,false);
              pBVar30 = (BaseRAPass *)(ulong)EVar14;
            }
            else {
              pBVar30 = (BaseRAPass *)(ulong)EVar14;
            }
          }
          else {
            pBVar30 = (BaseRAPass *)(ulong)EVar14;
          }
        }
        bVar43 = false;
        pBVar16 = local_348;
        pBVar39 = pBVar30;
        if ((int)pBVar30 == 0) {
          local_300 = local_300 & 0xffffffff00000000;
          local_2d0 = (BaseRAPass *)(local_318->super_FuncPass).super_Pass._name;
          pBVar24 = *(BaseRAPass **)&local_318->_allocator;
          pBVar30 = pBVar25;
          pBVar18 = local_318;
LAB_00126bd1:
          if (((ulong)(pBVar24->super_FuncPass).super_Pass._name & 0x2000) != 0) {
            pBVar41 = *(BaseRAPass **)&pBVar24->field_0x20;
            if (pBVar41 == (BaseRAPass *)0x0) goto LAB_00127bcc;
            uVar23 = *(uint *)&(pBVar41->super_FuncPass).super_Pass._name;
            pBVar42 = (BaseRAPass *)(ulong)uVar23;
            local_34c = CONCAT31(local_34c._1_3_,uVar23 == 0);
            if (uVar23 != 0) {
              local_2c8 = (BaseRAPass *)(ulong)-uVar23;
              pBVar41 = (BaseRAPass *)&pBVar41->field_0x54;
              pBVar38 = (BaseRAPass *)0x1;
              local_30c = uVar23;
              local_2b8 = pBVar24;
              do {
                FVar6 = *(FormatFlags *)&pBVar41[-1].field_0x4a8;
                pBVar39 = (BaseRAPass *)(ulong)FVar6;
                if (local_278._size <= FVar6) {
                  pBStack_360 = (BaseRAPass *)0x127a44;
                  buildLiveness();
LAB_00127a44:
                  pBStack_360 = (BaseRAPass *)0x127a49;
                  buildLiveness();
LAB_00127a49:
                  pBStack_360 = (BaseRAPass *)0x127a4e;
                  buildLiveness();
                  goto LAB_00127a4e;
                }
                pAVar2 = &((FormatOptions *)((long)local_278._data + 8))->_indentation +
                         (long)&pBVar39[-1].field_0x4ad;
                *(int *)pAVar2->_data = *(int *)pAVar2->_data + 1;
                if ((uint)local_288._8_4_ <= FVar6) goto LAB_00127a44;
                uVar23 = *(uint *)&(pBVar41->super_FuncPass).super_Pass._vptr_Pass;
                piVar3 = (int *)(local_288._0_8_ + (long)pBVar39 * 4);
                *piVar3 = *piVar3 + (uint)((uVar23 >> 1 & 1) != 0);
                if (*(FormatFlags *)&(pBVar18->_blocks).field_0x0 <= FVar6) goto LAB_00127a49;
                pBVar21 = pBVar18->_extraBlock;
                pBVar26 = (BaseRAPass *)(1L << ((byte)FVar6 & 0x3f));
                pBVar25 = (BaseRAPass *)(ulong)(FVar6 >> 6);
                uVar36 = *(ulong *)(pBVar21 + (long)pBVar25 * 8);
                uVar29 = 0x40000;
                if ((uVar36 >> ((ulong)pBVar39 & 0x3f) & 1) == 0) {
                  if (FVar6 < *(FormatFlags *)&pBVar18->_stop) {
                    if ((*(ulong *)(&pBVar18->_func->super_LabelNode + (long)pBVar25 * 8) &
                        (ulong)pBVar26) == 0) {
                      uVar29 = 0x20000;
                      goto LAB_00126c93;
                    }
                    goto LAB_00126cb8;
                  }
LAB_00127b52:
                  pBStack_360 = (BaseRAPass *)0x127b57;
                  buildLiveness();
                  goto LAB_00127b57;
                }
LAB_00126c93:
                *(uint *)&(pBVar41->super_FuncPass).super_Pass._vptr_Pass = uVar23 | uVar29;
LAB_00126cb8:
                pBVar21 = pBVar21 + (long)pBVar25 * 8;
                uVar23 = *(uint *)&(pBVar41->super_FuncPass).super_Pass._vptr_Pass;
                if ((uVar23 & 3) != 2) {
                  *(ulong *)pBVar21 = uVar36 & ~(ulong)pBVar26;
                  if (FVar6 < *(FormatFlags *)&pBVar18->_stop) {
                    pBVar21 = (BaseNode *)(&pBVar18->_func->super_LabelNode + (long)pBVar25 * 8);
                    uVar36 = *(ulong *)pBVar21;
                    goto LAB_00126cf0;
                  }
LAB_00127b43:
                  pBStack_360 = (BaseRAPass *)0x127b48;
                  buildLiveness();
LAB_00127b48:
                  pBStack_360 = (BaseRAPass *)0x127b4d;
                  buildLiveness();
LAB_00127b4d:
                  pBStack_360 = (BaseRAPass *)0x127b52;
                  buildLiveness();
                  goto LAB_00127b52;
                }
LAB_00126cf0:
                *(ulong *)pBVar21 = uVar36 | (ulong)pBVar26;
                if ((uVar23 >> 0xc & 1) != 0) {
                  if (FVar6 < *(FormatFlags *)&pBVar16->field_0x148) {
                    puVar1 = (uint *)(*(long *)(*(long *)&(pBVar16->_workRegs).field_0x0 +
                                               (long)pBVar39 * 8) + 0x24);
                    *puVar1 = *puVar1 | 0x10;
                    goto LAB_00126d18;
                  }
                  goto LAB_00127b48;
                }
LAB_00126d18:
                uVar23 = *(uint *)&pBVar41[-1].field_0x4ac;
                if ((ulong)uVar23 != 0xffffffff) {
                  if (*(uint *)&pBVar16->field_0x148 <= uVar23) {
                    pBStack_360 = (BaseRAPass *)0x127b43;
                    buildLiveness();
                    goto LAB_00127b43;
                  }
                  pBVar42 = *(BaseRAPass **)
                             (*(long *)&(pBVar16->_workRegs).field_0x0 + (ulong)uVar23 * 8);
                  this_00 = (BaseRAPass *)&(pBVar42->_formatOptions)._padding;
                  if (*(FormatFlags *)&pBVar42->_func <= FVar6) {
                    local_334 = (uint)pBVar30;
                    pBStack_360 = (BaseRAPass *)0x126d72;
                    local_2b0 = this_00;
                    uVar23 = ZoneBitVector::_resize
                                       ((ZoneBitVector *)this_00,(ZoneAllocator *)local_330,
                                        FVar6 + kMachineCode,FVar6 + kMachineCode,false);
                    pBVar30 = (BaseRAPass *)(ulong)local_334;
                    this_00 = local_2b0;
                    pBVar16 = local_348;
                    pBVar18 = local_318;
                    pBVar24 = local_2b8;
                    if (uVar23 == 0) goto LAB_00126d95;
LAB_00126dab:
                    bVar43 = uVar23 == 0;
                    if (!bVar43) {
                      pBVar30 = (BaseRAPass *)(ulong)uVar23;
                    }
                    pBVar42 = (BaseRAPass *)(ulong)local_30c;
                    goto LAB_00126dbd;
                  }
LAB_00126d95:
                  if (FVar6 < *(FormatFlags *)&pBVar42->_func) {
                    pp_Var4 = (this_00->super_FuncPass).super_Pass._vptr_Pass + (long)pBVar25;
                    *pp_Var4 = (_func_int *)((ulong)*pp_Var4 | (ulong)pBVar26);
                    uVar23 = 0;
                    goto LAB_00126dab;
                  }
                  goto LAB_00127b4d;
                }
                bVar43 = true;
LAB_00126dbd:
                if (!bVar43) break;
                uVar23 = (uint)pBVar38;
                local_34c = CONCAT31(local_34c._1_3_,(uint)pBVar42 <= uVar23);
                pBVar41 = (BaseRAPass *)&pBVar41->field_0x20;
                pBVar38 = (BaseRAPass *)(ulong)(uVar23 + 1);
              } while ((int)local_2c8 + uVar23 != 0);
            }
            pBVar38 = local_328;
            pBVar41 = local_320;
            if ((local_34c & 1) != 0) {
              local_300 = CONCAT44(local_300._4_4_,(int)local_300 + (local_34c & 1));
              goto LAB_00126e13;
            }
            bVar43 = false;
            goto LAB_00126e5e;
          }
LAB_00126e13:
          if (pBVar24 != local_2d0) goto code_r0x00126e1d;
          uVar23 = *(uint *)&(pBVar18->super_FuncPass).super_Pass._cb;
          if ((uint)local_298._8_4_ <= uVar23) goto LAB_00127c49;
          *(int *)(local_298._0_8_ + (ulong)uVar23 * 4) = (int)local_300;
          bVar43 = true;
        }
LAB_00126e5e:
        uVar23 = (uint)pBVar30;
        if (!bVar43) goto LAB_00126a90;
        pBVar18 = (BaseRAPass *)((long)&(((FuncPass *)local_2f8._32_8_)->super_Pass)._vptr_Pass + 1)
        ;
        pBVar24 = pBVar25;
        pBVar25 = pBVar30;
      } while (pBVar18 != local_340);
    }
    pBVar25 = local_330;
    local_2f8._0_16_ = (undefined1  [16])0x0;
    local_2f8._16_8_ = (char *)0x0;
    local_2a8 = (undefined1  [16])0x0;
    pBStack_360 = (BaseRAPass *)0x126eaf;
    EVar14 = ZoneStackBase::_init((ZoneStackBase *)local_2f8,(ZoneAllocator *)local_330,0x110);
    if (EVar14 != 0) {
      uVar23 = EVar14;
    }
    pBVar24 = (BaseRAPass *)(ulong)uVar23;
    pBVar39 = pBVar24;
    if (EVar14 == 0) {
      this_00 = (BaseRAPass *)local_2a8;
      pBStack_360 = (BaseRAPass *)0x126eda;
      EVar14 = ZoneBitVector::_resize
                         ((ZoneBitVector *)this_00,(ZoneAllocator *)pBVar25,
                          *(uint32_t *)&local_348->field_0xb8,*(uint32_t *)&local_348->field_0xb8,
                          true);
      pBVar16 = local_340;
      if (EVar14 == 0) {
        uVar23 = (int)pBVar41 + 0x3fU >> 6;
        pBVar42 = (BaseRAPass *)(ulong)uVar23;
        if ((int)local_340 != 0) {
          pBVar25 = (BaseRAPass *)0x0;
          pBVar18 = pBVar26;
          pBVar26 = pBVar24;
          do {
            if ((BaseRAPass *)(ulong)*(uint *)&local_348->field_0xd8 <= pBVar25) goto LAB_00127c4e;
            pBVar39 = *(BaseRAPass **)(*(long *)&(local_348->_pov).field_0x0 + (long)pBVar25 * 8);
            pBStack_360 = (BaseRAPass *)0x127809;
            this_00 = pBVar39;
            LiveOps::recalcInOut((RABlock *)pBVar39,uVar23,true);
            if ((_func_int **)local_2f8._0_8_ == (_func_int **)0x0) goto LAB_00127c53;
            if ((char *)(local_2f8._16_8_ + 0x1f8) < *(char **)(local_2f8._16_8_ + 0x18)) {
              this_00 = (BaseRAPass *)local_2f8;
              pBStack_360 = (BaseRAPass *)0x12783b;
              uVar29 = ZoneStackBase::_prepareBlock((ZoneStackBase *)this_00,1,0x20);
              if (uVar29 == 0) goto LAB_0012784c;
            }
            else {
LAB_0012784c:
              pcVar7 = *(char **)(local_2f8._16_8_ + 0x18);
              pBVar41 = pBVar16;
              if ((pcVar7 < (char *)(local_2f8._16_8_ + 0x20)) ||
                 ((char *)(local_2f8._16_8_ + 0x1f8) < pcVar7)) goto LAB_00127c44;
              *(BaseRAPass **)pcVar7 = pBVar39;
              *(char **)(local_2f8._16_8_ + 0x18) = pcVar7 + 8;
              uVar29 = 0;
            }
            pBVar24 = pBVar26;
            if (uVar29 != 0) {
              pBVar24 = (BaseRAPass *)(ulong)uVar29;
            }
            uVar40 = (uint)pBVar24;
            if (uVar29 != 0) goto LAB_00127a35;
            pBVar25 = (BaseRAPass *)((long)&(pBVar25->super_FuncPass).super_Pass._vptr_Pass + 1);
            pBVar18 = pBVar26;
            pBVar26 = pBVar24;
          } while (pBVar16 != pBVar25);
        }
        do {
          local_34c = uVar23;
          pBVar18 = (BaseRAPass *)local_2a8;
          pBVar41 = pBVar16;
          if ((_func_int **)local_2f8._0_8_ == (_func_int **)0x0) goto LAB_00127c58;
          pBVar39 = pBVar24;
          if (*(long *)&((BaseEmitter *)local_2f8._8_8_)->_diagnosticOptions ==
              *(long *)(local_2f8._16_8_ + 0x18)) goto LAB_00127b57;
          pBStack_360 = (BaseRAPass *)0x1278d8;
          pBVar25 = (BaseRAPass *)
                    ZoneStack<asmjit::v1_14::RABlock_*>::popFirst
                              ((ZoneStack<asmjit::v1_14::RABlock_*> *)local_2f8);
          pBStack_360 = (BaseRAPass *)0x1278e8;
          ZoneBitVector::setBit
                    ((ZoneBitVector *)pBVar18,*(uint32_t *)&(pBVar25->super_FuncPass).super_Pass._cb
                     ,false);
          pBStack_360 = (BaseRAPass *)0x1278f5;
          this_00 = pBVar25;
          bVar43 = LiveOps::recalcInOut((RABlock *)pBVar25,(uint32_t)pBVar42,false);
          if (bVar43) {
            uVar23 = *(uint *)&pBVar25->field_0x60;
            pBVar41 = (BaseRAPass *)(ulong)uVar23;
            pBVar26 = (BaseRAPass *)
                      CONCAT71((int7)((ulong)pBVar18 >> 8),pBVar41 != (BaseRAPass *)0x0);
            local_340 = pBVar16;
            if (pBVar41 != (BaseRAPass *)0x0) {
              pBVar42 = (BaseRAPass *)0x0;
              do {
                if (*(uint *)&pBVar25->field_0x60 <= (uint)pBVar42) goto LAB_00127c08;
                pBVar38 = *(BaseRAPass **)(*(long *)&pBVar25->field_0x58 + (long)pBVar42 * 8);
                uVar29 = *(uint *)&(pBVar38->super_FuncPass).super_Pass._cb;
                if ((uint)local_2a8._8_4_ <= uVar29) goto LAB_00127c0d;
                this_00 = (BaseRAPass *)(1L << ((byte)uVar29 & 0x3f));
                bVar43 = true;
                if (((ulong)*(_func_int **)(local_2a8._0_8_ + (ulong)(uVar29 >> 6) * 8) >>
                     ((ulong)uVar29 & 0x3f) & 1) == 0) {
                  *(_func_int **)(local_2a8._0_8_ + (ulong)(uVar29 >> 6) * 8) =
                       (_func_int *)
                       ((ulong)*(_func_int **)(local_2a8._0_8_ + (ulong)(uVar29 >> 6) * 8) |
                       (ulong)this_00);
                  if ((_func_int **)local_2f8._0_8_ == (_func_int **)0x0) goto LAB_00127c35;
                  if ((char *)(local_2f8._16_8_ + 0x1f8) < *(char **)(local_2f8._16_8_ + 0x18)) {
                    this_00 = (BaseRAPass *)local_2f8;
                    pBStack_360 = (BaseRAPass *)0x12799f;
                    EVar14 = ZoneStackBase::_prepareBlock((ZoneStackBase *)this_00,1,0x20);
                    pBVar16 = (BaseRAPass *)(ulong)EVar14;
                    pBVar39 = pBVar24;
                    if (EVar14 == 0) goto LAB_001279ab;
                  }
                  else {
LAB_001279ab:
                    pcVar7 = *(char **)(local_2f8._16_8_ + 0x18);
                    if ((pcVar7 < (char *)(local_2f8._16_8_ + 0x20)) ||
                       ((char *)(local_2f8._16_8_ + 0x1f8) < pcVar7)) goto LAB_00127c26;
                    *(BaseRAPass **)pcVar7 = pBVar38;
                    *(char **)(local_2f8._16_8_ + 0x18) = pcVar7 + 8;
                    pBVar16 = (BaseRAPass *)0x0;
                  }
                  bVar43 = (int)pBVar16 == 0;
                  if (!bVar43) {
                    pBVar24 = pBVar16;
                  }
                }
                pBVar38 = local_328;
                if (!bVar43) {
                  bVar43 = true;
                  pBVar42 = (BaseRAPass *)(ulong)local_34c;
                  goto LAB_00127a15;
                }
                pBVar42 = (BaseRAPass *)((long)&(pBVar42->super_FuncPass).super_Pass._vptr_Pass + 1)
                ;
                pBVar26 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar26 >> 8),(uint)pBVar42 < uVar23)
                ;
              } while ((uint)pBVar42 != uVar23);
              pBVar42 = (BaseRAPass *)(ulong)local_34c;
            }
            bVar43 = false;
LAB_00127a15:
            pBVar16 = local_340;
            if ((char)pBVar26 == '\0') goto LAB_00127a28;
          }
          else {
LAB_00127a28:
            pBVar16 = (BaseRAPass *)(ulong)((int)pBVar16 + 1);
            bVar43 = false;
          }
          uVar40 = (uint)pBVar24;
          uVar23 = local_34c;
        } while (!bVar43);
LAB_00127a35:
        pBVar39 = (BaseRAPass *)(ulong)uVar40;
        bVar43 = false;
        goto LAB_00126ef3;
      }
      pBVar39 = (BaseRAPass *)(ulong)EVar14;
    }
    bVar43 = false;
    goto LAB_00126ef3;
  }
  if (pBVar38 != (BaseRAPass *)0x0) {
    pBStack_360 = (BaseRAPass *)0x126ab5;
    Logger::logf((Logger *)pBVar38,fVar44);
    pBVar16 = (BaseRAPass *)0x0;
    goto LAB_00127ba5;
  }
LAB_00127ba2:
  pBVar16 = (BaseRAPass *)0x0;
LAB_00127ba5:
  pBStack_360 = (BaseRAPass *)0x127bb2;
  String::reset((String *)local_258);
  return (Error)pBVar16;
LAB_00127b57:
  pBStack_360 = (BaseRAPass *)0x127b65;
  ZoneStackBase::_init((ZoneStackBase *)local_2f8,(ZoneAllocator *)0x0,0);
  pBStack_360 = (BaseRAPass *)0x127b77;
  ZoneBitVector::release((ZoneBitVector *)local_2a8,(ZoneAllocator *)local_330);
  bVar43 = true;
LAB_00126ef3:
  this_00 = (BaseRAPass *)local_2f8;
  pBStack_360 = (BaseRAPass *)0x126f01;
  ZoneStackBase::_init((ZoneStackBase *)this_00,(ZoneAllocator *)0x0,0);
  pBVar16 = pBVar39;
  if (!bVar43) goto LAB_00127ba5;
  if (pBVar38 != (BaseRAPass *)0x0) {
    pBStack_360 = (BaseRAPass *)0x126f26;
    this_00 = pBVar38;
    Logger::logf((Logger *)pBVar38,__x);
    if (local_308 != (BaseRAPass *)0x0) {
      pBVar25 = (BaseRAPass *)local_258;
      pBVar41 = (BaseRAPass *)0x0;
      do {
        pBVar24 = local_348;
        pBVar26 = local_348;
        if ((BaseRAPass *)(ulong)*(uint *)&local_348->field_0xb8 <= pBVar41) goto LAB_00127c30;
        pBVar42 = *(BaseRAPass **)(*(long *)&local_348->_blocks + (long)pBVar41 * 8);
        pBStack_360 = (BaseRAPass *)0x126f73;
        EVar14 = String::_opFormat((String *)pBVar25,kAssign,"  {#%u}\n",
                                   (ulong)*(uint *)&(pBVar42->super_FuncPass).super_Pass._cb);
        if (EVar14 != 0) {
          pBVar16 = (BaseRAPass *)(ulong)EVar14;
          goto LAB_00127ba5;
        }
        pBStack_360 = (BaseRAPass *)0x126f8d;
        _dumpBlockLiveness(pBVar24,(String *)pBVar25,(RABlock *)pBVar42);
        pBVar22 = (BaseBuilder *)(ulong)(byte)local_258[0];
        pRVar27 = (RABlocks *)(local_258 + 1);
        if ((BaseBuilder *)0x1e < (BaseBuilder *)(ulong)(byte)local_258[0]) {
          pBVar22 = pBStack_250;
          pRVar27 = pRStack_240;
        }
        pBStack_360 = (BaseRAPass *)0x126fbd;
        this_00 = pBVar38;
        (*(pBVar38->super_FuncPass).super_Pass._vptr_Pass[2])(pBVar38,pRVar27,pBVar22);
        pBVar41 = (BaseRAPass *)((long)&(pBVar41->super_FuncPass).super_Pass._vptr_Pass + 1);
      } while (local_308 != pBVar41);
    }
  }
  pBVar41 = (BaseRAPass *)(ulong)((int)local_320 + (uint)((int)local_320 == 0));
  pBVar30 = (BaseRAPass *)0x0;
  pBVar24 = local_348;
  pBVar16 = local_330;
  pBVar18 = pBVar39;
  do {
    pBVar25 = pBVar30;
    pBVar26 = pBVar24;
    if ((BaseRAPass *)(ulong)*(uint *)&pBVar24->field_0x148 <= pBVar30) goto LAB_00127c12;
    if ((BaseRAPass *)(ulong)local_278._size <= pBVar30) goto LAB_00127c17;
    pBVar39 = *(BaseRAPass **)(*(long *)&(pBVar24->_workRegs).field_0x0 + (long)pBVar30 * 8);
    uVar23 = *(uint *)(&((FormatOptions *)((long)local_278._data + 8))->_indentation)
                      [(long)&pBVar30[-1].field_0x4ad]._data;
    uVar29 = 0;
    if (*(uint *)((long)&pBVar39->_iEmitHelper + 4) < uVar23) {
      this_00 = (BaseRAPass *)&pBVar39->field_0x70;
      pBStack_360 = (BaseRAPass *)0x127089;
      uVar29 = ZoneVectorBase::_reserve((ZoneVectorBase *)this_00,(ZoneAllocator *)pBVar16,8,uVar23)
      ;
      pBVar24 = local_348;
      pBVar16 = local_330;
    }
    if (uVar29 == 0) {
      pBVar26 = pBVar24;
      if ((BaseRAPass *)(ulong)(uint)local_288._8_4_ <= pBVar30) goto LAB_00127c3a;
      uVar23 = *(uint *)(local_288._0_8_ + (long)pBVar30 * 4);
      uVar29 = 0;
      pBVar25 = pBVar16;
      if (*(uint *)(pBVar39->_formatOptions)._indentation._data < uVar23) {
        pBVar39 = (BaseRAPass *)&pBVar39->_logger;
        pBStack_360 = (BaseRAPass *)0x1270ac;
        this_00 = pBVar39;
        uVar29 = ZoneVectorBase::_reserve
                           ((ZoneVectorBase *)pBVar39,(ZoneAllocator *)pBVar16,8,uVar23);
        pBVar24 = local_348;
        pBVar25 = local_330;
      }
      bVar43 = uVar29 == 0;
      pBVar26 = pBVar18;
      if (!bVar43) {
        pBVar26 = (BaseRAPass *)(ulong)uVar29;
      }
    }
    else {
      bVar43 = false;
      pBVar25 = pBVar16;
      pBVar26 = (BaseRAPass *)(ulong)uVar29;
    }
    pBVar16 = pBVar26;
    if (!bVar43) goto LAB_00127ba5;
    pBVar30 = (BaseRAPass *)((long)&(pBVar30->super_FuncPass).super_Pass._vptr_Pass + 1);
    pBVar16 = pBVar25;
    pBVar18 = pBVar26;
  } while (pBVar41 != pBVar30);
  pBStack_360 = (BaseRAPass *)0x1270d6;
  ZoneVector<unsigned_int>::release((ZoneVector<unsigned_int> *)&local_278,(ZoneAllocator *)pBVar25)
  ;
  this_00 = (BaseRAPass *)local_288;
  pBStack_360 = (BaseRAPass *)0x1270e6;
  ZoneVector<unsigned_int>::release((ZoneVector<unsigned_int> *)this_00,(ZoneAllocator *)pBVar25);
  pBVar24 = local_348;
  if (local_308 != (BaseRAPass *)0x0) {
    pBVar30 = (BaseRAPass *)0x2;
    pBVar16 = (BaseRAPass *)0x0;
    pBVar32 = pBVar26;
    pBVar34 = local_308;
    local_320 = pBVar41;
LAB_00127114:
    if ((BaseRAPass *)(ulong)*(uint *)&pBVar24->field_0xb8 <= pBVar16) goto LAB_00127c5d;
    local_300 = *(ulong *)(*(long *)&(pBVar24->_blocks).field_0x0 + (long)pBVar16 * 8);
    iVar15 = 0x3e;
    pBVar26 = pBVar18;
    if ((*(byte *)(local_300 + 0xc) & 2) == 0) goto LAB_0012777b;
    if ((BaseRAPass *)(ulong)(uint)local_298._8_4_ <= pBVar16) goto LAB_00127c62;
    local_2b8 = (BaseRAPass *)CONCAT44(local_2b8._4_4_,*(undefined4 *)(local_300 + 8));
    pBVar26 = *(BaseRAPass **)(local_300 + 0x10);
    local_2f8._32_8_ = *(BaseRAPass **)(local_300 + 0x18);
    local_34c = (int)pBVar30 + *(int *)(local_298._0_8_ + (long)pBVar16 * 4) * 2;
    *(int *)(local_300 + 0x20) = (int)pBVar30;
    *(uint *)(local_300 + 0x24) = local_34c;
    local_2f8._0_16_ = ZEXT816(0);
    pBVar41 = *(BaseRAPass **)(local_300 + 0x78);
    uVar23 = *(int *)(local_300 + 0x80) + 0x3fU & 0xffffffc0;
    pBVar25 = (BaseRAPass *)(ulong)uVar23;
    local_340 = pBVar16;
    if (uVar23 == 0) {
      pBVar16 = (BaseRAPass *)0x0;
LAB_001271c0:
      pBVar37 = (BaseRAPass *)0x0;
    }
    else {
      pBVar37 = (BaseRAPass *)(pBVar41->super_FuncPass).super_Pass._vptr_Pass;
      pBVar41 = (BaseRAPass *)&(pBVar41->super_FuncPass).super_Pass._cb;
      if (pBVar37 == (BaseRAPass *)0x0) {
        pBVar38 = (BaseRAPass *)0x40;
        do {
          pBVar16 = pBVar38;
          if (pBVar25 <= pBVar16) goto LAB_001271c0;
          pBVar37 = (BaseRAPass *)(pBVar41->super_FuncPass).super_Pass._vptr_Pass;
          pBVar41 = (BaseRAPass *)&(pBVar41->super_FuncPass).super_Pass._cb;
          pBVar38 = (BaseRAPass *)&pBVar16->field_0x40;
        } while (pBVar37 == (BaseRAPass *)0x0);
      }
      else {
        pBVar16 = (BaseRAPass *)0x0;
      }
    }
    do {
      pBVar39 = pBVar26;
      pBVar42 = pBVar16;
      if (pBVar37 == (BaseRAPass *)0x0) {
        AVar49._data[0] = 0;
        AVar49._data[1] = 0;
        DVar50 = kNone;
        uVar23 = 0;
        uVar29 = 0;
        pBVar16 = local_340;
        this_00 = (BaseRAPass *)local_2f8._32_8_;
        pBVar38 = local_328;
        pBVar41 = local_320;
        goto LAB_00127315;
      }
      pBVar38 = (BaseRAPass *)((ulong)&pBVar37[-1].field_0x4af & (ulong)pBVar37);
      while ((pBVar38 == (BaseRAPass *)0x0 &&
             (pBVar42 = (BaseRAPass *)&pBVar42->field_0x40, pBVar42 < pBVar25))) {
        pBVar38 = (BaseRAPass *)(pBVar41->super_FuncPass).super_Pass._vptr_Pass;
        pBVar41 = (BaseRAPass *)&(pBVar41->super_FuncPass).super_Pass._cb;
      }
      lVar10 = 0;
      if (pBVar37 != (BaseRAPass *)0x0) {
        for (; ((ulong)pBVar37 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
        }
      }
      uVar36 = (ulong)(uint)((int)lVar10 + (int)pBVar16);
      if (*(uint *)&pBVar24->field_0x148 <= uVar36) goto LAB_00127bfe;
      pBVar39 = *(BaseRAPass **)(*(long *)&(pBVar24->_workRegs).field_0x0 + uVar36 * 8);
      bVar13 = pBVar39->field_0x21 & 0xf;
      if (3 < bVar13) goto LAB_00127c03;
      *(int *)(local_2f8 + (ulong)bVar13 * 4) = *(int *)(local_2f8 + (ulong)bVar13 * 4) + 1;
      this_00 = (BaseRAPass *)&pBVar39->field_0x50;
      iVar15 = *(int *)&pBVar39->field_0x58;
      if (iVar15 == 0) {
LAB_0012725e:
        if (iVar15 != *(int *)&pBVar39->field_0x5c) {
LAB_00127264:
          lVar10 = *(long *)&pBVar39->field_0x50;
          uVar36 = (ulong)*(uint *)&pBVar39->field_0x58;
          *(int *)(lVar10 + uVar36 * 0xc) = (int)pBVar30;
          *(uint *)(lVar10 + 4 + uVar36 * 0xc) = local_34c;
          *(undefined4 *)(lVar10 + 8 + uVar36 * 0xc) = 0xff;
          *(int *)&pBVar39->field_0x58 = *(int *)&pBVar39->field_0x58 + 1;
          goto LAB_00127298;
        }
        local_334 = (uint)pBVar32;
        pBStack_360 = (BaseRAPass *)0x1272cf;
        local_2c0 = pBVar30;
        uVar23 = ZoneVectorBase::_grow((ZoneVectorBase *)this_00,(ZoneAllocator *)local_330,0xc,1);
        pBVar32 = (BaseRAPass *)(ulong)local_334;
        pBVar30 = local_2c0;
        pBVar34 = local_308;
        pBVar24 = local_348;
        if (uVar23 == 0) goto LAB_00127264;
      }
      else {
        if (*(uint *)(*(long *)this_00 + 4 + (ulong)(iVar15 - 1) * 0xc) < (uint)pBVar30)
        goto LAB_0012725e;
        *(uint *)(*(long *)this_00 + (ulong)(iVar15 - 1) * 0xc + 4) = local_34c;
LAB_00127298:
        uVar23 = 0;
      }
      pBVar18 = pBVar26;
      pBVar37 = pBVar38;
      pBVar16 = pBVar42;
    } while (uVar23 == 0);
    pBVar32 = (BaseRAPass *)(ulong)uVar23;
    iVar15 = 1;
    pBVar16 = local_340;
    pBVar38 = local_328;
    pBVar39 = pBVar26;
    pBVar41 = local_320;
LAB_0012777b:
    uVar23 = (uint)pBVar32;
    if ((iVar15 != 0x3e) && (iVar15 != 0)) goto LAB_00126a90;
    pBVar16 = (BaseRAPass *)((long)&(pBVar16->super_FuncPass).super_Pass._vptr_Pass + 1);
    pBVar18 = pBVar26;
    if (pBVar16 == pBVar34) goto LAB_00127a4e;
    goto LAB_00127114;
  }
LAB_00127a4e:
  uVar23 = *(uint *)&pBVar24->field_0x148;
  lVar10 = *(long *)&pBVar24->_workRegs;
  pBVar16 = (BaseRAPass *)0x0;
  do {
    if (pBVar16 == (BaseRAPass *)(ulong)uVar23) goto LAB_00127c2b;
    lVar33 = *(long *)(lVar10 + (long)pBVar16 * 8);
    if ((ulong)*(uint *)(lVar33 + 0x58) == 0) {
      uVar29 = 0;
    }
    else {
      lVar35 = 0;
      uVar29 = 0;
      do {
        uVar29 = (uVar29 + *(int *)(*(long *)(lVar33 + 0x50) + 4 + lVar35)) -
                 *(int *)(*(long *)(lVar33 + 0x50) + lVar35);
        lVar35 = lVar35 + 0xc;
      } while ((ulong)*(uint *)(lVar33 + 0x58) * 0xc != lVar35);
    }
    if (uVar29 == 0) {
      fVar44 = 0.0;
    }
    else {
      fVar44 = (float)((double)*(uint *)(lVar33 + 0x78) / (double)uVar29);
    }
    *(uint *)(lVar33 + 0x60) = uVar29;
    *(float *)(lVar33 + 100) = fVar44;
    bVar13 = *(byte *)(*(long *)(lVar33 + 8) + 0xe);
    this_00 = (BaseRAPass *)(ulong)bVar13;
    *(float *)(lVar33 + 0x68) = (float)bVar13 * 0.01 + fVar44;
    pBVar16 = (BaseRAPass *)((long)&(pBVar16->super_FuncPass).super_Pass._vptr_Pass + 1);
  } while (pBVar16 != pBVar41);
  if (pBVar38 != (BaseRAPass *)0x0) {
    pBStack_360 = (BaseRAPass *)0x127b17;
    String::clear((String *)local_258);
    pBStack_360 = (BaseRAPass *)0x127b22;
    _dumpLiveSpans(pBVar24,(String *)local_258);
    pBVar22 = (BaseBuilder *)(ulong)(byte)local_258[0];
    if (pBVar22 < (BaseBuilder *)0x1f) {
      pRVar27 = (RABlocks *)(local_258 + 1);
    }
    else {
      pBVar22 = pBStack_250;
      pRVar27 = pRStack_240;
    }
    pBStack_360 = (BaseRAPass *)0x127b90;
    (*(pBVar38->super_FuncPass).super_Pass._vptr_Pass[2])(pBVar38,pRVar27,pBVar22);
  }
  pBStack_360 = (BaseRAPass *)0x127ba2;
  ZoneVector<unsigned_int>::release
            ((ZoneVector<unsigned_int> *)local_298,(ZoneAllocator *)local_330);
  goto LAB_00127ba2;
LAB_00127315:
  pBVar26 = pBVar18;
  if (((ulong)(pBVar39->super_FuncPass).super_Pass._name & 0x2000) != 0) {
    pBVar18 = *(BaseRAPass **)&pBVar39->field_0x20;
    if (pBVar18 == (BaseRAPass *)0x0) goto LAB_00127c3f;
    uVar40 = *(uint *)&(pBVar18->super_FuncPass).super_Pass._name;
    pBVar42 = (BaseRAPass *)(ulong)uVar40;
    *(int *)((long)&(pBVar39->super_FuncPass).super_Pass._name + 4) = (int)pBVar30;
    local_2d0 = (BaseRAPass *)&pBVar18->field_0x1c;
    *(undefined4 *)&pBVar18->field_0x1c = local_2f8._0_4_;
    *(undefined4 *)&pBVar18->field_0x20 = local_2f8._4_4_;
    *(undefined4 *)&pBVar18->field_0x24 = local_2f8._8_4_;
    *(undefined4 *)&pBVar18->field_0x28 = local_2f8._12_4_;
    iVar15 = 0x47;
    pBVar26 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar26 >> 8),uVar40 != 0);
    if (uVar40 != 0) {
      local_2b0 = (BaseRAPass *)(ulong)-uVar40;
      pBVar38 = (BaseRAPass *)&pBVar18->field_0x60;
      pBVar25 = (BaseRAPass *)0x1;
      local_2c8 = pBVar39;
      local_318 = pBVar18;
      local_30c = uVar40;
      do {
        uVar40 = *(uint *)&pBVar38[-1].field_0x49c;
        pBVar39 = local_2c8;
        if (*(uint *)&pBVar24->field_0x148 <= uVar40) goto LAB_00127bd1;
        pBVar42 = *(BaseRAPass **)(*(long *)&(pBVar24->_workRegs).field_0x0 + (ulong)uVar40 * 8);
        if (((OperandSignature *)((long)&pBVar42->_iEmitHelper + 4))->_bits <=
            *(uint *)&pBVar42->_iEmitHelper) goto LAB_00127bd6;
        *(BaseRAPass **)(*(long *)&pBVar42->field_0x70 + (ulong)*(uint *)&pBVar42->_iEmitHelper * 8)
             = local_2c8;
        *(int *)&pBVar42->_iEmitHelper = *(int *)&pBVar42->_iEmitHelper + 1;
        if ((pBVar38[-1].field_0x4a4 & 2) != 0) {
          FVar6 = (pBVar42->_formatOptions)._flags;
          if (*(FormatFlags *)(pBVar42->_formatOptions)._indentation._data <= FVar6)
          goto LAB_00127be0;
          *(BaseRAPass **)(&(pBVar42->_logger->_options)._indentation + (ulong)FVar6 * 2 + -3) =
               local_2c8;
          (pBVar42->_formatOptions)._flags = (pBVar42->_formatOptions)._flags + kMachineCode;
        }
        if (*(int *)&pBVar42->field_0x28 != (int)local_2b8) {
          *(undefined4 *)&pBVar42->field_0x28 = 0xffffffff;
          pBVar42->field_0x24 = pBVar42->field_0x24 | 4;
        }
        if ((*(uint *)&pBVar38[-1].field_0x4a4 >> 0x11 & 1) != 0) {
          if (*(uint *)(local_300 + 0x90) <= uVar40) goto LAB_00127be5;
          if ((*(ulong *)(*(long *)(local_300 + 0x88) + (ulong)(uVar40 >> 6) * 8) >>
               ((ulong)uVar40 & 0x3f) & 1) == 0) {
            *(uint *)&pBVar38[-1].field_0x4a4 = *(uint *)&pBVar38[-1].field_0x4a4 | 0x40000;
          }
        }
        pBVar39 = (BaseRAPass *)&pBVar42->field_0x50;
        uVar40 = (~*(uint *)&pBVar38[-1].field_0x4a4 & 1) + (int)pBVar30;
        iVar15 = *(int *)&pBVar42->field_0x58;
        if (iVar15 == 0) {
LAB_0012746f:
          if (iVar15 != *(int *)&pBVar42->field_0x5c) {
LAB_00127479:
            lVar10 = *(long *)&pBVar42->field_0x50;
            uVar36 = (ulong)*(uint *)&pBVar42->field_0x58;
            *(uint *)(lVar10 + uVar36 * 0xc) = uVar40;
            *(uint *)(lVar10 + 4 + uVar36 * 0xc) = local_34c;
            *(undefined4 *)(lVar10 + 8 + uVar36 * 0xc) = 0xff;
            *(int *)&pBVar42->field_0x58 = *(int *)&pBVar42->field_0x58 + 1;
            bVar43 = false;
            goto LAB_001274af;
          }
          local_334 = (uint)pBVar32;
          pBStack_360 = (BaseRAPass *)0x12761e;
          this_00 = pBVar39;
          local_2c0 = pBVar30;
          local_268._data = AVar49._data;
          DStack_264 = DVar50;
          uStack_260 = uVar23;
          uStack_25c = uVar29;
          uVar28 = ZoneVectorBase::_grow((ZoneVectorBase *)pBVar39,(ZoneAllocator *)local_330,0xc,1)
          ;
          pBVar32 = (BaseRAPass *)(ulong)local_334;
          pBVar30 = local_2c0;
          pBVar34 = local_308;
          pBVar24 = local_348;
          AVar49._data = local_268._data;
          DVar50 = DStack_264;
          uVar23 = uStack_260;
          uVar29 = uStack_25c;
          if (uVar28 == 0) goto LAB_00127479;
          bVar43 = false;
        }
        else {
          uVar28 = *(uint *)(*(long *)pBVar39 + 4 + (ulong)(iVar15 - 1) * 0xc);
          if (uVar28 < uVar40) goto LAB_0012746f;
          bVar43 = uVar40 < uVar28;
          *(uint *)(*(long *)pBVar39 + 4 + (ulong)(iVar15 - 1) * 0xc) = local_34c;
LAB_001274af:
          uVar28 = 0;
        }
        pBVar16 = local_340;
        pBVar41 = local_320;
        if (uVar28 != 0) {
          pBVar32 = (BaseRAPass *)(ulong)uVar28;
          iVar15 = 1;
          this_00 = (BaseRAPass *)local_2f8._32_8_;
          pBVar38 = local_328;
          pBVar39 = local_2c8;
          goto LAB_00127690;
        }
        bVar13 = pBVar42->field_0x21 & 0xf;
        uVar36 = (ulong)(byte)pBVar42->field_0x21 & 0xf;
        if (!bVar43) {
          if (3 < bVar13) goto LAB_00127bea;
          uVar19 = (ulong)(uint)((int)uVar36 * 4);
          *(int *)(local_2f8 + uVar19) = *(int *)(local_2f8 + uVar19) + 1;
          piVar3 = (int *)((long)&(local_2d0->super_FuncPass).super_Pass._vptr_Pass + uVar19);
          *piVar3 = *piVar3 + 1;
        }
        uVar40 = *(uint *)&pBVar38[-1].field_0x4a4;
        if ((uVar40 >> 0x12 & 1) != 0) {
          if (*(int *)&pBVar42->field_0x58 == 0) goto LAB_00127bef;
          this_00 = *(BaseRAPass **)pBVar39;
          *(uint *)((long)&(this_00->super_FuncPass).super_Pass._vptr_Pass +
                   (ulong)(*(int *)&pBVar42->field_0x58 - 1) * 0xc + 4) =
               (int)pBVar30 - (uVar40 | 0xfffffffe);
          if (3 < bVar13) goto LAB_00127bf4;
          *(int *)(local_2f8 + uVar36 * 4) = *(int *)(local_2f8 + uVar36 * 4) + -1;
          pBVar26 = pBVar30;
        }
        bVar17 = pBVar38[-1].field_0x4aa;
        pBVar39 = local_2c8;
        if (bVar17 != 0xff) {
          uVar28 = 1 << (bVar17 & 0x1f);
          this_00 = (BaseRAPass *)(ulong)uVar28;
          *(uint *)&pBVar42->field_0x2c = *(uint *)&pBVar42->field_0x2c | uVar28;
          if (pBVar42->field_0x4b == -1) {
            if (3 < bVar13) goto LAB_00127c1c;
            pBVar26 = local_318;
            if ((((OperandSignature *)(&local_318->_formatOptions + -7))[uVar36 + 2]._bits & uVar28)
                == 0) {
              pBVar42->field_0x4b = bVar17;
            }
          }
        }
        uVar28 = *(uint *)&pBVar38[-1].field_0x4ac;
        if ((uVar28 != 0) &&
           (*(uint *)&pBVar42->field_0x30 = *(uint *)&pBVar42->field_0x30 & uVar28,
           (pBVar42->field_0x24 & 0x10) != 0)) {
          *(uint *)&pBVar42->field_0x34 = *(uint *)&pBVar42->field_0x34 & uVar28;
        }
        uVar28 = *(uint *)&(pBVar38->super_FuncPass).super_Pass._vptr_Pass;
        if ((uVar28 != 0) &&
           (*(uint *)&pBVar42->field_0x30 = *(uint *)&pBVar42->field_0x30 & uVar28,
           (pBVar42->field_0x24 & 0x10) != 0)) {
          *(uint *)&pBVar42->field_0x34 = *(uint *)&pBVar42->field_0x34 & uVar28;
        }
        if (3 < bVar13) goto LAB_00127bdb;
        if (((uVar40 & 0x40008) == 0) &&
           (uVar40 = ((OperandSignature *)(&local_318->_formatOptions + -7))[uVar36 + 2]._bits,
           uVar40 != 0)) {
          *(uint *)&pBVar42->field_0x38 = *(uint *)&pBVar42->field_0x38 | uVar40;
        }
        pBVar42 = (BaseRAPass *)(ulong)local_30c;
        uVar40 = (uint)pBVar25;
        pBVar26 = (BaseRAPass *)CONCAT71((int7)((ulong)pBVar26 >> 8),uVar40 < local_30c);
        pBVar38 = (BaseRAPass *)&pBVar38->field_0x20;
        pBVar25 = (BaseRAPass *)(ulong)(uVar40 + 1);
      } while ((int)local_2b0 + uVar40 != 0);
      iVar15 = 0x47;
      this_00 = (BaseRAPass *)local_2f8._32_8_;
      pBVar38 = local_328;
    }
LAB_00127690:
    if ((char)pBVar26 == '\0') {
      if (*(char *)&(pBVar39->super_FuncPass).super_Pass._name == '\x12') {
        pFVar8 = pBVar24->_func;
        bVar17 = *(byte *)((long)&pBVar39->_logger + 5);
        bVar13 = (pFVar8->_frame)._callStackAlignment;
        if (bVar17 < bVar13) {
          bVar17 = bVar13;
        }
        (pFVar8->_frame)._callStackAlignment = bVar17;
        bVar13 = (pFVar8->_frame)._finalStackAlignment;
        if (bVar17 < bVar13) {
          bVar17 = bVar13;
        }
        (pFVar8->_frame)._finalStackAlignment = bVar17;
      }
      uVar40 = *(uint *)&(local_2d0->super_FuncPass).super_Pass._vptr_Pass;
      DVar11 = *(DiagnosticOptions *)((long)&(local_2d0->super_FuncPass).super_Pass._vptr_Pass + 4);
      uVar28 = *(uint *)&(local_2d0->super_FuncPass).super_Pass._cb;
      uVar12 = *(uint *)((long)&(local_2d0->super_FuncPass).super_Pass._cb + 4);
      uVar45 = -(uint)((int)(uVar40 ^ 0x80000000) < (int)((uint)AVar49._data ^ 0x80000000));
      DVar46 = -(uint)((int)(DVar11 ^ 0x80000000) < (int)(DVar50 ^ 0x80000000));
      uVar47 = -(uint)((int)(uVar28 ^ 0x80000000) < (int)(uVar23 ^ 0x80000000));
      uVar48 = -(uint)((int)(uVar12 ^ 0x80000000) < (int)(uVar29 ^ 0x80000000));
      AVar49._data = (unsigned_short  [2])((uint)AVar49._data & uVar45 | ~uVar45 & uVar40);
      DVar50 = DVar50 & DVar46 | ~DVar46 & DVar11;
      uVar23 = uVar23 & uVar47 | ~uVar47 & uVar28;
      uVar29 = uVar29 & uVar48 | ~uVar48 & uVar12;
      pBVar30 = (BaseRAPass *)(ulong)((int)pBVar30 + 2);
      iVar15 = 0;
    }
    if (iVar15 != 0) goto LAB_0012777b;
  }
  if (pBVar39 == this_00) goto LAB_00127733;
  pBVar39 = (BaseRAPass *)(pBVar39->super_FuncPass).super_Pass._cb;
  pBVar18 = pBVar26;
  if (pBVar39 == (BaseRAPass *)0x0) goto LAB_00127c21;
  goto LAB_00127315;
LAB_00127733:
  *(unsigned_short (*) [2])(local_300 + 0x34) = AVar49._data;
  *(DiagnosticOptions *)(local_300 + 0x38) = DVar50;
  *(uint *)(local_300 + 0x3c) = uVar23;
  *(uint *)(local_300 + 0x40) = uVar29;
  uVar40 = (pBVar24->_globalMaxLiveCount).n._data[0];
  DVar11 = (pBVar24->_globalMaxLiveCount).n._data[1];
  uVar28 = (pBVar24->_globalMaxLiveCount).n._data[2];
  uVar12 = (pBVar24->_globalMaxLiveCount).n._data[3];
  uVar45 = -(uint)((int)((uint)AVar49._data ^ 0x80000000) < (int)(uVar40 ^ 0x80000000));
  DVar46 = -(uint)((int)(DVar50 ^ 0x80000000) < (int)(DVar11 ^ 0x80000000));
  uVar47 = -(uint)((int)(uVar23 ^ 0x80000000) < (int)(uVar28 ^ 0x80000000));
  uVar48 = -(uint)((int)(uVar29 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000));
  (pBVar24->_globalMaxLiveCount).n._data[0] = ~uVar45 & (uint)AVar49._data | uVar40 & uVar45;
  (pBVar24->_globalMaxLiveCount).n._data[1] = ~DVar46 & DVar50 | DVar11 & DVar46;
  (pBVar24->_globalMaxLiveCount).n._data[2] = ~uVar47 & uVar23 | uVar28 & uVar47;
  (pBVar24->_globalMaxLiveCount).n._data[3] = ~uVar48 & uVar29 | uVar12 & uVar48;
  iVar15 = 0;
  if ((int)pBVar30 != *(int *)(local_300 + 0x24)) goto LAB_00127c67;
  goto LAB_0012777b;
code_r0x00126e1d:
  pBVar24 = (BaseRAPass *)(pBVar24->super_FuncPass).super_Pass._vptr_Pass;
  if (pBVar24 != (BaseRAPass *)0x0) goto LAB_00126bd1;
  pBStack_360 = (BaseRAPass *)0x127bcc;
  buildLiveness();
LAB_00127bcc:
  pBStack_360 = (BaseRAPass *)0x127bd1;
  buildLiveness();
LAB_00127bd1:
  pBStack_360 = (BaseRAPass *)0x127bd6;
  buildLiveness();
LAB_00127bd6:
  pBStack_360 = (BaseRAPass *)0x127bdb;
  buildLiveness();
LAB_00127bdb:
  pBStack_360 = (BaseRAPass *)0x127be0;
  buildLiveness();
LAB_00127be0:
  pBStack_360 = (BaseRAPass *)0x127be5;
  buildLiveness();
LAB_00127be5:
  pBStack_360 = (BaseRAPass *)0x127bea;
  buildLiveness();
LAB_00127bea:
  pBStack_360 = (BaseRAPass *)0x127bef;
  buildLiveness();
LAB_00127bef:
  pBVar30 = pBVar26;
  pBStack_360 = (BaseRAPass *)0x127bf4;
  buildLiveness();
LAB_00127bf4:
  pBStack_360 = (BaseRAPass *)0x127bf9;
  buildLiveness();
  pBVar24 = pBVar25;
LAB_00127bf9:
  pBVar25 = pBVar24;
  pBStack_360 = (BaseRAPass *)0x127bfe;
  buildLiveness();
  pBVar18 = pBVar30;
LAB_00127bfe:
  pBVar26 = pBVar18;
  pBStack_360 = (BaseRAPass *)0x127c03;
  buildLiveness();
LAB_00127c03:
  pBStack_360 = (BaseRAPass *)0x127c08;
  buildLiveness();
LAB_00127c08:
  pBStack_360 = (BaseRAPass *)0x127c0d;
  buildLiveness();
LAB_00127c0d:
  pBStack_360 = (BaseRAPass *)0x127c12;
  buildLiveness();
LAB_00127c12:
  pBStack_360 = (BaseRAPass *)0x127c17;
  buildLiveness();
LAB_00127c17:
  pBStack_360 = (BaseRAPass *)0x127c1c;
  buildLiveness();
LAB_00127c1c:
  pBStack_360 = (BaseRAPass *)0x127c21;
  buildLiveness();
LAB_00127c21:
  pBStack_360 = (BaseRAPass *)0x127c26;
  buildLiveness();
LAB_00127c26:
  pBStack_360 = (BaseRAPass *)0x127c2b;
  buildLiveness();
LAB_00127c2b:
  pBStack_360 = (BaseRAPass *)0x127c30;
  buildLiveness();
LAB_00127c30:
  pBStack_360 = (BaseRAPass *)0x127c35;
  buildLiveness();
LAB_00127c35:
  pBStack_360 = (BaseRAPass *)0x127c3a;
  buildLiveness();
LAB_00127c3a:
  pBStack_360 = (BaseRAPass *)0x127c3f;
  buildLiveness();
LAB_00127c3f:
  pBStack_360 = (BaseRAPass *)0x127c44;
  buildLiveness();
LAB_00127c44:
  pBStack_360 = (BaseRAPass *)0x127c49;
  buildLiveness();
LAB_00127c49:
  pBStack_360 = (BaseRAPass *)0x127c4e;
  buildLiveness();
  pBVar18 = pBVar26;
  pBVar16 = pBVar41;
LAB_00127c4e:
  pBVar26 = pBVar18;
  pBStack_360 = (BaseRAPass *)0x127c53;
  buildLiveness();
LAB_00127c53:
  pBStack_360 = (BaseRAPass *)0x127c58;
  buildLiveness();
  pBVar18 = pBVar26;
  pBVar41 = pBVar16;
LAB_00127c58:
  pBStack_360 = (BaseRAPass *)0x127c5d;
  buildLiveness();
LAB_00127c5d:
  pBStack_360 = (BaseRAPass *)0x127c62;
  buildLiveness();
  pBVar26 = pBVar18;
LAB_00127c62:
  pBStack_360 = (BaseRAPass *)0x127c67;
  buildLiveness();
LAB_00127c67:
  pBStack_360 = (BaseRAPass *)assignArgIndexToWorkRegs;
  buildLiveness();
  pBStack_388 = pBVar25;
  pBStack_380 = pBVar38;
  pBStack_378 = pBVar39;
  pBStack_370 = pBVar41;
  pBStack_368 = pBVar42;
  pBStack_360 = pBVar26;
  if (*(int *)&this_00->field_0xb8 == 0) {
LAB_00127de7:
    pBStack_3a8 = (BaseRAPass *)annotateCode;
    assignArgIndexToWorkRegs();
    auStack_7f8._24_8_ = auStack_7d8;
    auStack_7f8._8_8_ = (BaseBuilder *)0x0;
    auStack_7f8._0_8_ = (_func_int **)0x20;
    auStack_7f8._16_8_ = (char *)0x407;
    auStack_7d8[0] = 0;
    plVar20 = *(long **)&(this_00->_blocks).field_0x0;
    plVar5 = plVar20 + *(uint *)&this_00->field_0xb8;
    pBStack_3d0 = pBVar25;
    pBStack_3c8 = pBVar38;
    pBStack_3c0 = pBVar39;
    pBStack_3b8 = pBVar41;
    pBStack_3b0 = pBVar42;
    pBStack_3a8 = pBVar26;
    do {
      if (plVar20 == plVar5) {
        String::reset((String *)auStack_7f8);
        return 0;
      }
      pBVar21 = *(BaseNode **)(*plVar20 + 0x10);
      if (pBVar21 != (BaseNode *)0x0) {
        pBVar9 = *(BaseNode **)(*plVar20 + 0x18);
        while( true ) {
          String::clear((String *)auStack_7f8);
          Formatter::formatNode
                    ((String *)auStack_7f8,&this_00->_formatOptions,
                     (this_00->super_FuncPass).super_Pass._cb,pBVar21);
          if (((((this_00->_diagnosticOptions & kRADebugLiveness) != kNone) &&
               (((byte)pBVar21[0x11] & 0x20) != 0)) &&
              (lVar10 = *(long *)(pBVar21 + 0x20), lVar10 != 0)) && (*(int *)(lVar10 + 0x10) != 0))
          {
            String::padEnd((String *)auStack_7f8,0x28,' ');
            pBVar38 = (BaseRAPass *)auStack_7f8;
            String::_opString((String *)auStack_7f8,kAppend," | ",0xffffffffffffffff);
            uVar23 = *(uint *)(lVar10 + 0x10);
            if ((ulong)uVar23 != 0) {
              lVar33 = 0;
              do {
                if (lVar33 != 0) {
                  pBVar38 = (BaseRAPass *)auStack_7f8;
                  String::_opChar((String *)auStack_7f8,kAppend,' ');
                }
                uVar29 = *(uint *)(lVar10 + 0x4c + lVar33);
                if (*(uint *)&this_00->field_0x148 <= uVar29) {
                  annotateCode();
                  EVar14 = initGlobalLiveSpans(pBVar38);
                  if (EVar14 != 0) {
                    return EVar14;
                  }
                  group = k0;
                  do {
                    EVar14 = binPack(pBVar38,group);
                    if (EVar14 != 0) {
                      return EVar14;
                    }
                    group = group + kVec;
                  } while (group != kPC);
                  return 0;
                }
                lVar35 = *(long *)(*(long *)(*(long *)&(this_00->_workRegs).field_0x0 +
                                            (ulong)uVar29 * 8) + 8);
                if (*(uint *)(lVar35 + 0x18) < 0xc) {
                  lVar35 = lVar35 + 0x1c;
                }
                else {
                  lVar35 = *(long *)(lVar35 + 0x20);
                }
                String::_opFormat((String *)auStack_7f8,kAppend,"%s{",lVar35);
                uVar29 = *(uint *)(lVar10 + 0x54 + lVar33);
                c = 'X';
                if ((((~uVar29 & 3) != 0) && (c = 'R', (uVar29 & 1) == 0)) &&
                   (c = 'W', (uVar29 & 2) == 0)) {
                  c = '?';
                }
                String::_opChar((String *)auStack_7f8,kAppend,c);
                uVar29 = *(uint *)(lVar10 + 0x54 + lVar33);
                if ((uVar29 >> 0xc & 1) != 0) {
                  String::_opFormat((String *)auStack_7f8,kAppend,"|Lead[%u]",
                                    (ulong)((uVar29 >> 0xd & 3) + 1));
                }
                if (*(char *)(lVar10 + 0x5a + lVar33) == -1) {
                  if ((*(byte *)(lVar10 + 0x54 + lVar33) & 4) != 0) {
                    String::_opString((String *)auStack_7f8,kAppend,"|Use",0xffffffffffffffff);
                  }
                }
                else {
                  String::_opFormat((String *)auStack_7f8,kAppend,"|Use=%u");
                }
                uVar29 = *(uint *)(lVar10 + 0x54 + lVar33);
                if ((uVar29 & 0x1400) == 0x400) {
                  String::_opFormat((String *)auStack_7f8,kAppend,"+%u",(ulong)(uVar29 >> 0xd & 3));
                }
                if (*(char *)(lVar10 + 0x5b + lVar33) == -1) {
                  if ((*(byte *)(lVar10 + 0x54 + lVar33) & 8) != 0) {
                    String::_opString((String *)auStack_7f8,kAppend,"|Out",0xffffffffffffffff);
                  }
                }
                else {
                  String::_opFormat((String *)auStack_7f8,kAppend,"|Out=%u");
                }
                uVar29 = *(uint *)(lVar10 + 0x54 + lVar33);
                if ((uVar29 & 0x1800) == 0x800) {
                  String::_opFormat((String *)auStack_7f8,kAppend,"+%u",(ulong)(uVar29 >> 0xd & 3));
                }
                if ((*(byte *)(lVar10 + 0x56 + lVar33) & 2) != 0) {
                  String::_opString((String *)auStack_7f8,kAppend,"|Last",0xffffffffffffffff);
                }
                if ((*(byte *)(lVar10 + 0x56 + lVar33) & 4) != 0) {
                  String::_opString((String *)auStack_7f8,kAppend,"|Kill",0xffffffffffffffff);
                }
                pBVar38 = (BaseRAPass *)auStack_7f8;
                String::_opString((String *)auStack_7f8,kAppend,"}",0xffffffffffffffff);
                lVar33 = lVar33 + 0x20;
              } while ((ulong)uVar23 << 5 != lVar33);
            }
          }
          iVar15 = (int)auStack_7f8 + 1;
          if (0x1e < (byte)auStack_7f8[0]) {
            iVar15 = (int)auStack_7f8._24_8_;
          }
          iVar15 = Zone::dup(&((this_00->super_FuncPass).super_Pass._cb)->_dataZone,iVar15);
          *(ulong *)(pBVar21 + 0x28) = CONCAT44(extraout_var,iVar15);
          if (pBVar21 == pBVar9) break;
          pBVar21 = *(BaseNode **)(pBVar21 + 8);
        }
      }
      plVar20 = plVar20 + 1;
    } while( true );
  }
  pFVar8 = this_00->_func;
  uStack_390 = (ulong)(byte)pFVar8->field_0xa8;
  if (uStack_390 != 0) {
    lVar10 = **(long **)&(this_00->_blocks).field_0x0;
    uStack_398 = (ulong)(byte)pFVar8->field_0xa8;
    puVar31 = &pFVar8->field_0xd0;
    lVar33 = 4;
    uVar36 = 0;
    do {
      if (uVar36 == uStack_398) {
LAB_00127de2:
        pBStack_3a8 = (BaseRAPass *)0x127de7;
        assignArgIndexToWorkRegs();
        goto LAB_00127de7;
      }
      pBVar25 = (BaseRAPass *)(this_00->super_FuncPass).super_Pass._cb;
      pBVar41 = (BaseRAPass *)this_00->_archTraits;
      pBVar42 = (BaseRAPass *)((long)&pFVar8->_args->_data[0]._signature._bits + lVar33);
      pBVar38 = (BaseRAPass *)0x0;
      do {
        if (*(int *)((long)pBVar42 + (long)pBVar38 * 8 + -4) != 0) {
          uVar23 = *(int *)(&(pBVar42->super_FuncPass).super_Pass._vptr_Pass + (long)pBVar38) -
                   0x100;
          pBVar26 = (BaseRAPass *)(ulong)uVar23;
          if (uVar23 < (pBVar25->_fp).super_Operand.super_Operand_._data[0]) {
            if ((pBVar25->_fp).super_Operand.super_Operand_._data[0] <= uVar23) {
              pBStack_3a8 = (BaseRAPass *)0x127dd3;
              assignArgIndexToWorkRegs();
LAB_00127dd3:
              pBStack_3a8 = (BaseRAPass *)0x127dd8;
              assignArgIndexToWorkRegs();
LAB_00127dd8:
              pBStack_3a8 = (BaseRAPass *)0x127ddd;
              assignArgIndexToWorkRegs();
LAB_00127ddd:
              pBStack_3a8 = (BaseRAPass *)0x127de2;
              assignArgIndexToWorkRegs();
              goto LAB_00127de2;
            }
            pBVar26 = *(BaseRAPass **)&(pBVar25->_fp).super_Operand.super_Operand_;
            pBVar39 = (BaseRAPass *)(&(pBVar26->super_FuncPass).super_Pass._vptr_Pass)[uVar23];
            if ((pBVar39 != (BaseRAPass *)0x0) &&
               (pBVar39 = *(BaseRAPass **)&pBVar39->field_0x28, pBVar39 != (BaseRAPass *)0x0)) {
              uVar23 = *(uint *)&(pBVar39->super_FuncPass).super_Pass._vptr_Pass;
              if (*(uint *)(lVar10 + 0x80) <= uVar23) goto LAB_00127dd3;
              pBVar26 = (BaseRAPass *)(ulong)(uVar23 >> 6);
              if ((*(ulong *)(*(long *)(lVar10 + 0x78) + (long)pBVar26 * 8) >>
                   ((ulong)uVar23 & 0x3f) & 1) == 0) goto LAB_00127d9a;
              pBVar39->field_0x48 = (char)uVar36;
              pBVar39->field_0x49 = (char)pBVar38;
              if (0x1f < uVar36) goto LAB_00127dd8;
              uVar23 = *(uint *)(puVar31 + (long)pBVar38 * 4);
              pBVar26 = (BaseRAPass *)(ulong)uVar23;
              if ((uVar23 >> 8 & 1) != 0) {
                if (0x1fffffff < uVar23) goto LAB_00127ddd;
                if (((*(uint *)&pBVar39->field_0x20 ^
                     *(uint *)(&(pBVar41->_formatOptions)._indentation)
                              [(ulong)(uVar23 >> 0x18) - 0x1e]._data) & 0xf00) == 0) {
                  pBVar26 = (BaseRAPass *)(ulong)(uVar23 >> 0x10);
                  pBVar39->field_0x4b = (char)(uVar23 >> 0x10);
                }
              }
            }
          }
        }
LAB_00127d9a:
        pBVar38 = (BaseRAPass *)((long)&(pBVar38->super_FuncPass).super_Pass._vptr_Pass + 1);
      } while (pBVar38 != (BaseRAPass *)0x4);
      uVar36 = uVar36 + 1;
      lVar33 = lVar33 + 0x20;
      puVar31 = puVar31 + 0x10;
    } while (uVar36 != uStack_390);
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SPEED Error BaseRAPass::buildLiveness() noexcept {
#ifndef ASMJIT_NO_LOGGING
  Logger* logger = getLoggerIf(DiagnosticOptions::kRADebugLiveness);
  StringTmp<512> sb;
#endif

  ASMJIT_RA_LOG_FORMAT("[BuildLiveness]\n");

  uint32_t i;

  uint32_t numAllBlocks = blockCount();
  uint32_t numReachableBlocks = reachableBlockCount();

  uint32_t numWorkRegs = workRegCount();
  uint32_t numBitWords = ZoneBitVector::_wordsPerBits(numWorkRegs);

  if (!numWorkRegs) {
    ASMJIT_RA_LOG_FORMAT("  Done (no virtual registers)\n");
    return kErrorOk;
  }

  ZoneVector<uint32_t> nUsesPerWorkReg; // Number of USEs of each RAWorkReg.
  ZoneVector<uint32_t> nOutsPerWorkReg; // Number of OUTs of each RAWorkReg.
  ZoneVector<uint32_t> nInstsPerBlock;  // Number of instructions of each RABlock.

  ASMJIT_PROPAGATE(nUsesPerWorkReg.resize(allocator(), numWorkRegs));
  ASMJIT_PROPAGATE(nOutsPerWorkReg.resize(allocator(), numWorkRegs));
  ASMJIT_PROPAGATE(nInstsPerBlock.resize(allocator(), numAllBlocks));

  // Calculate GEN/KILL of Each Block
  // --------------------------------

  for (i = 0; i < numReachableBlocks; i++) {
    RABlock* block = _pov[i];
    ASMJIT_PROPAGATE(block->resizeLiveBits(numWorkRegs));

    BaseNode* node = block->last();
    BaseNode* stop = block->first();

    uint32_t nInsts = 0;
    for (;;) {
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();
        RAInst* raInst = inst->passData<RAInst>();
        ASMJIT_ASSERT(raInst != nullptr);

        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t count = raInst->tiedCount();

        for (uint32_t j = 0; j < count; j++) {
          RATiedReg* tiedReg = &tiedRegs[j];
          uint32_t workId = tiedReg->workId();

          // Update `nUses` and `nOuts`.
          nUsesPerWorkReg[workId] += 1u;
          nOutsPerWorkReg[workId] += uint32_t(tiedReg->isWrite());

          // Mark as:
          //   KILL - if this VirtReg is killed afterwards.
          //   LAST - if this VirtReg is last in this basic block.
          if (block->kill().bitAt(workId))
            tiedReg->addFlags(RATiedFlags::kKill);
          else if (!block->gen().bitAt(workId))
            tiedReg->addFlags(RATiedFlags::kLast);

          if (tiedReg->isWriteOnly()) {
            // KILL.
            block->kill().setBit(workId, true);
          }
          else {
            // GEN.
            block->kill().setBit(workId, false);
            block->gen().setBit(workId, true);
          }

          if (tiedReg->isLeadConsecutive()) {
            RAWorkReg* workReg = workRegById(workId);
            workReg->markLeadConsecutive();
          }

          if (tiedReg->hasConsecutiveParent()) {
            RAWorkReg* consecutiveParentReg = workRegById(tiedReg->consecutiveParent());
            ASMJIT_PROPAGATE(consecutiveParentReg->addImmediateConsecutive(allocator(), workId));
          }
        }

        nInsts++;
      }

      if (node == stop)
        break;

      node = node->prev();
      ASMJIT_ASSERT(node != nullptr);
    }

    nInstsPerBlock[block->blockId()] = nInsts;
  }

  // Calculate IN/OUT of Each Block
  // ------------------------------

#ifndef ASMJIT_NO_LOGGING
  uint32_t numVisits = numReachableBlocks;
#endif

  {
    ZoneStack<RABlock*> workList;
    ZoneBitVector workBits;

    ASMJIT_PROPAGATE(workList.init(allocator()));
    ASMJIT_PROPAGATE(workBits.resize(allocator(), blockCount(), true));

    for (i = 0; i < numReachableBlocks; i++) {
      RABlock* block = _pov[i];
      LiveOps::recalcInOut(block, numBitWords, true);
      ASMJIT_PROPAGATE(workList.append(block));
    }

    while (!workList.empty()) {
      RABlock* block = workList.popFirst();
      uint32_t blockId = block->blockId();

      workBits.setBit(blockId, false);
      if (LiveOps::recalcInOut(block, numBitWords)) {
        const RABlocks& predecessors = block->predecessors();
        uint32_t numPredecessors = predecessors.size();

        for (uint32_t j = 0; j < numPredecessors; j++) {
          RABlock* pred = predecessors[j];
          if (!workBits.bitAt(pred->blockId())) {
            workBits.setBit(pred->blockId(), true);
            ASMJIT_PROPAGATE(workList.append(pred));
          }
        }
      }
#ifndef ASMJIT_NO_LOGGING
      numVisits++;
#endif
    }

    workList.reset();
    workBits.release(allocator());
  }

  ASMJIT_RA_LOG_COMPLEX({
    logger->logf("  LiveIn/Out Done (%u visits)\n", numVisits);
    for (i = 0; i < numAllBlocks; i++) {
      RABlock* block = _blocks[i];

      ASMJIT_PROPAGATE(sb.assignFormat("  {#%u}\n", block->blockId()));
      ASMJIT_PROPAGATE(_dumpBlockLiveness(sb, block));

      logger->log(sb);
    }
  });

  // Reserve the space in each `RAWorkReg` for references
  // ----------------------------------------------------

  for (i = 0; i < numWorkRegs; i++) {
    RAWorkReg* workReg = workRegById(i);
    ASMJIT_PROPAGATE(workReg->_refs.reserve(allocator(), nUsesPerWorkReg[i]));
    ASMJIT_PROPAGATE(workReg->_writes.reserve(allocator(), nOutsPerWorkReg[i]));
  }

  // These are not needed anymore, so release the memory now so other allocations can reuse it.
  nUsesPerWorkReg.release(allocator());
  nOutsPerWorkReg.release(allocator());

  // Assign block and instruction positions, build LiveCount and LiveSpans
  // ---------------------------------------------------------------------

  // This is a starting position, reserving [0, 1] for function arguments.
  uint32_t position = 2;

  for (i = 0; i < numAllBlocks; i++) {
    RABlock* block = _blocks[i];
    if (!block->isReachable())
      continue;

    uint32_t blockId = block->blockId();

    BaseNode* node = block->first();
    BaseNode* stop = block->last();

    uint32_t endPosition = position + nInstsPerBlock[i] * 2;
    block->setFirstPosition(position);
    block->setEndPosition(endPosition);

    RALiveCount curLiveCount;
    RALiveCount maxLiveCount;

    // Process LIVE-IN.
    ZoneBitVector::ForEachBitSet it(block->liveIn());
    while (it.hasNext()) {
      RAWorkReg* workReg = _workRegs[uint32_t(it.next())];
      curLiveCount[workReg->group()]++;
      ASMJIT_PROPAGATE(workReg->liveSpans().openAt(allocator(), position, endPosition));
    }

    for (;;) {
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();
        RAInst* raInst = inst->passData<RAInst>();

        // Impossible - each processed instruction node must have an associated RAInst.
        ASMJIT_ASSERT(raInst != nullptr);

        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t count = raInst->tiedCount();

        inst->setPosition(position);
        raInst->_liveCount = curLiveCount;

        for (uint32_t j = 0; j < count; j++) {
          RATiedReg* tiedReg = &tiedRegs[j];
          uint32_t workId = tiedReg->workId();

          // Create refs and writes.
          RAWorkReg* workReg = workRegById(workId);
          workReg->_refs.appendUnsafe(node);
          if (tiedReg->isWrite()) {
            workReg->_writes.appendUnsafe(node);
          }

          if (workReg->singleBasicBlockId() != blockId) {
            workReg->markUseOfMultipleBasicBlocks();
          }

          // We couldn't calculate this in previous steps, but since we know all LIVE-OUT at this point it becomes
          // trivial. If this is the last instruction that uses this `workReg` and it's not LIVE-OUT then it is
          // KILLed here.
          if (tiedReg->isLast() && !block->liveOut().bitAt(workId)) {
            tiedReg->addFlags(RATiedFlags::kKill);
          }

          LiveRegSpans& liveSpans = workReg->liveSpans();
          bool wasOpen;
          ASMJIT_PROPAGATE(liveSpans.openAt(allocator(), position + !tiedReg->isRead(), endPosition, wasOpen));

          RegGroup group = workReg->group();
          if (!wasOpen) {
            curLiveCount[group]++;
            raInst->_liveCount[group]++;
          }

          if (tiedReg->isKill()) {
            liveSpans.closeAt(position + !tiedReg->isRead() + 1);
            curLiveCount[group]--;
          }

          // Update `RAWorkReg::useIdMask` and `RAWorkReg::hintRegId`.
          if (tiedReg->hasUseId()) {
            uint32_t useId = tiedReg->useId();
            workReg->addUseIdMask(Support::bitMask(useId));
            if (!workReg->hasHintRegId() && !Support::bitTest(raInst->_clobberedRegs[group], useId)) {
              workReg->setHintRegId(useId);
            }
          }

          if (tiedReg->useRegMask()) {
            workReg->restrictPreferredMask(tiedReg->useRegMask());
            if (workReg->isLeadConsecutive()) {
              workReg->restrictConsecutiveMask(tiedReg->useRegMask());
            }
          }

          if (tiedReg->outRegMask()) {
            workReg->restrictPreferredMask(tiedReg->outRegMask());
            if (workReg->isLeadConsecutive()) {
              workReg->restrictConsecutiveMask(tiedReg->outRegMask());
            }
          }

          // Update `RAWorkReg::clobberedSurvivalMask`.
          if (raInst->_clobberedRegs[group] && !tiedReg->isOutOrKill()) {
            workReg->addClobberSurvivalMask(raInst->_clobberedRegs[group]);
          }
        }

        if (node->isInvoke()) {
          func()->frame().updateCallStackAlignment(node->as<InvokeNode>()->detail().naturalStackAlignment());
        }

        position += 2;
        maxLiveCount.op<Support::Max>(raInst->_liveCount);
      }

      if (node == stop)
        break;

      node = node->next();
      ASMJIT_ASSERT(node != nullptr);
    }

    block->_maxLiveCount = maxLiveCount;
    _globalMaxLiveCount.op<Support::Max>(maxLiveCount);
    ASMJIT_ASSERT(position == block->endPosition());
  }

  // Calculate WorkReg statistics
  // ----------------------------

  for (i = 0; i < numWorkRegs; i++) {
    RAWorkReg* workReg = _workRegs[i];

    LiveRegSpans& spans = workReg->liveSpans();
    uint32_t width = spans.width();
    float freq = width ? float(double(workReg->_refs.size()) / double(width)) : float(0);

    RALiveStats& stats = workReg->liveStats();
    stats._width = width;
    stats._freq = freq;
    stats._priority = freq + float(int(workReg->virtReg()->weight())) * 0.01f;
  }

  ASMJIT_RA_LOG_COMPLEX({
    sb.clear();
    _dumpLiveSpans(sb);
    logger->log(sb);
  });

  nInstsPerBlock.release(allocator());

  return kErrorOk;
}